

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_hair.cpp
# Opt level: O1

Builder * embree::avx::BVH4Curve4vBuilder_OBB_New(void *bvh,Scene *scene,size_t mode)

{
  long lVar1;
  Builder *pBVar2;
  _func_int **pp_Var3;
  
  pBVar2 = (Builder *)operator_new(0x78);
  (pBVar2->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pBVar2->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__BVHNHairBuilderSAH_02211ea8;
  pBVar2[1].super_RefCount._vptr_RefCount = (_func_int **)bvh;
  pBVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)scene;
  lVar1 = *(long *)&(scene->super_AccelN).field_0x188;
  pp_Var3 = (_func_int **)(lVar1 + 0x550);
  if (lVar1 == 0) {
    pp_Var3 = (_func_int **)0x0;
  }
  pBVar2[2].super_RefCount._vptr_RefCount = pp_Var3;
  *(undefined1 *)&pBVar2[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  pBVar2[4].super_RefCount._vptr_RefCount = (_func_int **)0x0;
  pBVar2[3].super_RefCount._vptr_RefCount = (_func_int **)0x0;
  pBVar2[3].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  pBVar2[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 2;
  pBVar2[5].super_RefCount._vptr_RefCount = (_func_int **)0x20;
  pBVar2[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  pBVar2[6].super_RefCount._vptr_RefCount = (_func_int **)0x1;
  pBVar2[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 7;
  pBVar2[7].super_RefCount._vptr_RefCount = (_func_int **)0xffffffffffffffff;
  return pBVar2;
}

Assistant:

Builder* BVH4Curve4vBuilder_OBB_New   (void* bvh, Scene* scene, size_t mode) { return new BVHNHairBuilderSAH<4,Curve4v,Line4i,Point4i>((BVH4*)bvh,scene); }